

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ipv4_tbl.c
# Opt level: O0

zt_ipv4_node * zt_ipv4_tbl_add_frm_str(zt_ipv4_tbl *tbl,char *netstr)

{
  int iVar1;
  char *in_RSI;
  long in_RDI;
  zt_ipv4_node *unaff_retaddr;
  zt_ipv4_node *ipv4_node;
  zt_ipv4_node *local_8;
  
  if ((in_RDI == 0) || (in_RSI == (char *)0x0)) {
    local_8 = (zt_ipv4_node *)0x0;
  }
  else if (*(long *)(in_RDI + 0x130) == 0) {
    local_8 = zt_ipv4_node_str_init(in_RSI);
    if (local_8 == (zt_ipv4_node *)0x0) {
      local_8 = (zt_ipv4_node *)0x0;
    }
    else {
      iVar1 = zt_ipv4_tbl_add_node((zt_ipv4_tbl *)ipv4_node,unaff_retaddr);
      if (iVar1 != 0) {
        local_8 = (zt_ipv4_node *)0x0;
      }
    }
  }
  else {
    local_8 = *(zt_ipv4_node **)(in_RDI + 0x130);
  }
  return local_8;
}

Assistant:

zt_ipv4_node   *
zt_ipv4_tbl_add_frm_str(zt_ipv4_tbl * tbl, const char *netstr)
{
    zt_ipv4_node *ipv4_node = NULL;

    if (!tbl || !netstr) {
        return NULL;
    }

    if (tbl->any) {
        /*
         * we had a 0.0.0.0/0, we don't need to insert anything more
         */
        return tbl->any;
    }

    if (!(ipv4_node = zt_ipv4_node_str_init(netstr))) {
        return NULL;
    }

    if (zt_ipv4_tbl_add_node(tbl, ipv4_node)) {
        return NULL;
    }

    return ipv4_node;
}